

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wl_window.c
# Opt level: O2

void setCursorImage(_GLFWwindow *window,_GLFWcursorWayland *cursorWayland)

{
  wl_cursor *pwVar1;
  wl_cursor_image *pwVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  wl_surface *surface;
  uint32_t uVar6;
  int hotspot_x;
  wl_cursor *pwVar7;
  wl_buffer *buffer;
  uint32_t uVar8;
  int32_t x;
  int32_t scale;
  int32_t hotspot_y;
  itimerspec timer;
  
  surface = _glfw.wl.cursorSurface;
  timer.it_value.tv_sec = 0;
  timer.it_value.tv_nsec = 0;
  timer.it_interval.tv_sec = 0;
  timer.it_interval.tv_nsec = 0;
  pwVar7 = cursorWayland->cursor;
  if (pwVar7 == (wl_cursor *)0x0) {
    buffer = cursorWayland->buffer;
    uVar6 = cursorWayland->xhot;
    uVar8 = cursorWayland->yhot;
    scale = 1;
  }
  else {
    if ((window->wl).bufferScale < 2) {
      scale = 1;
    }
    else {
      pwVar1 = cursorWayland->cursorHiDPI;
      if (pwVar1 != (wl_cursor *)0x0) {
        pwVar7 = pwVar1;
      }
      scale = (pwVar1 != (wl_cursor *)0x0) + 1;
    }
    pwVar2 = pwVar7->images[cursorWayland->currentImage];
    buffer = (*_glfw.wl.cursor.image_get_buffer)(pwVar2);
    if (buffer == (wl_buffer *)0x0) {
      return;
    }
    timer.it_value.tv_sec = (ulong)pwVar2->delay / 1000;
    timer.it_value.tv_nsec = (__syscall_slong_t)((pwVar2->delay % 1000) * 1000000);
    timerfd_settime(_glfw.wl.cursorTimerfd,0,(itimerspec *)&timer,(itimerspec *)0x0);
    uVar3 = pwVar2->height;
    uVar4 = pwVar2->hotspot_x;
    uVar5 = pwVar2->hotspot_y;
    uVar6 = pwVar2->hotspot_x;
    uVar8 = pwVar2->hotspot_y;
    cursorWayland->width = pwVar2->width;
    cursorWayland->height = uVar3;
    cursorWayland->xhot = uVar4;
    cursorWayland->yhot = uVar5;
  }
  hotspot_x = (int)uVar6 / scale;
  hotspot_y = (int)uVar8 / scale;
  wl_pointer_set_cursor(_glfw.wl.pointer,_glfw.wl.pointerEnterSerial,surface,hotspot_x,hotspot_y);
  wl_surface_set_buffer_scale(surface,scale);
  wl_surface_attach(surface,buffer,x,hotspot_x);
  wl_surface_damage(surface,cursorWayland->width,cursorWayland->height,hotspot_x,hotspot_y);
  wl_surface_commit(surface);
  return;
}

Assistant:

static void setCursorImage(_GLFWwindow* window,
                           _GLFWcursorWayland* cursorWayland)
{
    struct itimerspec timer = {0};
    struct wl_cursor* wlCursor = cursorWayland->cursor;
    struct wl_cursor_image* image;
    struct wl_buffer* buffer;
    struct wl_surface* surface = _glfw.wl.cursorSurface;
    int scale = 1;

    if (!wlCursor)
        buffer = cursorWayland->buffer;
    else
    {
        if (window->wl.bufferScale > 1 && cursorWayland->cursorHiDPI)
        {
            wlCursor = cursorWayland->cursorHiDPI;
            scale = 2;
        }

        image = wlCursor->images[cursorWayland->currentImage];
        buffer = wl_cursor_image_get_buffer(image);
        if (!buffer)
            return;

        timer.it_value.tv_sec = image->delay / 1000;
        timer.it_value.tv_nsec = (image->delay % 1000) * 1000000;
        timerfd_settime(_glfw.wl.cursorTimerfd, 0, &timer, NULL);

        cursorWayland->width = image->width;
        cursorWayland->height = image->height;
        cursorWayland->xhot = image->hotspot_x;
        cursorWayland->yhot = image->hotspot_y;
    }

    wl_pointer_set_cursor(_glfw.wl.pointer, _glfw.wl.pointerEnterSerial,
                          surface,
                          cursorWayland->xhot / scale,
                          cursorWayland->yhot / scale);
    wl_surface_set_buffer_scale(surface, scale);
    wl_surface_attach(surface, buffer, 0, 0);
    wl_surface_damage(surface, 0, 0,
                      cursorWayland->width, cursorWayland->height);
    wl_surface_commit(surface);
}